

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.cpp
# Opt level: O1

FormatInformation
ZXing::QRCode::FormatInformation::DecodeRMQR(uint32_t formatInfoBits1,uint32_t formatInfoBits2)

{
  ErrorCorrectionLevel EVar1;
  ulong uVar3;
  FormatInformation FVar5;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  allocator_type local_5a;
  allocator_type local_59;
  uint32_t local_58;
  uint32_t local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  ulong uVar2;
  undefined4 uVar4;
  
  local_54 = formatInfoBits1;
  if (formatInfoBits2 == 0) {
    __l_01._M_len = 1;
    __l_01._M_array = &local_54;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_50,__l_01,(allocator_type *)&local_58);
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FVar5 = FindBestFormatInfoRMQR(&local_50,&local_38);
    uVar2 = FVar5._0_8_;
    uVar4 = FVar5._8_4_;
  }
  else {
    __l._M_len = 1;
    __l._M_array = &local_54;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,&local_59);
    __l_00._M_len = 1;
    __l_00._M_array = &local_58;
    local_58 = formatInfoBits2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,__l_00,&local_5a);
    FVar5 = FindBestFormatInfoRMQR(&local_50,&local_38);
    uVar4 = FVar5._8_4_;
    uVar2 = FVar5._0_8_;
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  EVar1 = ECLevelFromBits((uint)(uVar2 >> 0x24) & 2,false);
  uVar3 = uVar2 & 0xffffffffffffff;
  FVar5._8_8_ = (ulong)((uint)(uVar2 >> 0x18) & 0x1f00) +
                (CONCAT44(EVar1,uVar4) & 0xffffffffffff0000) + 0x104;
  FVar5.mask = (int)uVar3;
  FVar5.data = (char)(uVar3 >> 0x20);
  FVar5.hammingDistance = (char)(uVar3 >> 0x28);
  FVar5.bitsIndex = (char)(uVar3 >> 0x30);
  FVar5.isMirrored = (bool)(char)(uVar3 >> 0x38);
  return FVar5;
}

Assistant:

FormatInformation FormatInformation::DecodeRMQR(uint32_t formatInfoBits1, uint32_t formatInfoBits2)
{
	FormatInformation fi;
	if (formatInfoBits2)
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {formatInfoBits2});
	else // TODO probably remove if `sampleRMQR()` done properly
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {});

	// Bit 6 is error correction (M/H), and bits 0-5 version.
	fi.ecLevel = ECLevelFromBits(((fi.data >> 5) & 1) << 1); // Shift to match QRCode M/H
	fi.dataMask = 4; // ((y / 2) + (x / 3)) % 2 == 0
	fi.microVersion = (fi.data & 0x1F) + 1;
	fi.isMirrored = false; // TODO: implement mirrored format bit reading

	return fi;
}